

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playmidi.cpp
# Opt level: O2

void __thiscall Timidity::Renderer::adjust_volume(Renderer *this,int chan)

{
  Voice *v;
  long lVar1;
  long lVar3;
  bool bVar4;
  long lVar2;
  
  lVar3 = (long)this->voices;
  lVar1 = lVar3 * 0x170;
  while( true ) {
    lVar2 = lVar1;
    lVar1 = lVar2 + -0x170;
    bVar4 = lVar3 == 0;
    lVar3 = lVar3 + -1;
    if (bVar4) break;
    if (((uint)(&this->voice[-1].channel)[lVar2] == chan) &&
       (v = (Voice *)(&this->voice[-1].status + lVar2), (v->status & 1) != 0)) {
      recompute_amp(this,v);
      apply_envelope_to_amp((Voice *)(&this->voice[-1].status + lVar2));
    }
  }
  return;
}

Assistant:

void Renderer::adjust_volume(int chan)
{
	int i = voices;
	while (i--)
	{
		if (voice[i].channel == chan && (voice[i].status & VOICE_RUNNING))
		{
			recompute_amp(&voice[i]);
			apply_envelope_to_amp(&voice[i]);
		}
	}
}